

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetOProbabilitiesExactScopes
          (TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Aii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Yii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Oii,Index *oIndex)

{
  long *plVar1;
  Index IVar2;
  ulong uVar3;
  const_reference ppCVar4;
  reference pvVar5;
  long *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  value_type extraout_XMM0_Qa;
  value_type vVar6;
  uint *in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000028;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000030;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000038;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000040;
  Index valI;
  Index iiI;
  Index in_stack_0000004c;
  TwoStageDynamicBayesianNetwork *in_stack_00000050;
  size_t nrVals;
  vector<double,_std::allocator<double>_> *probs;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<double,_std::allocator<double>_> *this_00;
  uint local_64;
  
  plVar1 = (long *)*in_RSI;
  this_00 = in_RDI;
  uVar3 = (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x188)) + 0xc0))
                    ((long)plVar1 + *(long *)(*plVar1 + -0x188),*in_stack_00000008);
  vVar6 = extraout_XMM0_Qa;
  std::allocator<double>::allocator((allocator<double> *)0xaf3e0c);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(size_type)in_RSI,(value_type_conflict3 *)in_RDI,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::allocator<double>::~allocator((allocator<double> *)0xaf3e31);
  IVar2 = IndividualToJointOiiIndices
                    (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_00000038,
                     in_stack_00000030,in_stack_00000028);
  for (local_64 = 0; local_64 < uVar3; local_64 = local_64 + 1) {
    ppCVar4 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::
              operator[]((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                         (in_RSI + 0x53),(ulong)*in_stack_00000008);
    (*(*ppCVar4)->_vptr_CPDDiscreteInterface[2])(*ppCVar4,(ulong)local_64,(ulong)IVar2);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_64);
    *pvVar5 = vVar6;
  }
  return in_RDI;
}

Assistant:

vector<double> TwoStageDynamicBayesianNetwork::
GetOProbabilitiesExactScopes( 
                    const vector<Index>& Xii,
                    const vector<Index>& Aii,
                    const vector<Index>& Yii,
                    const vector<Index>& Oii,
                    const Index& oIndex //agentI
                ) const
{
    size_t nrVals = _m_madp->GetNrObservations(oIndex);
    vector<double> probs(nrVals, 0.0);
    Index iiI = IndividualToJointOiiIndices(oIndex, Xii ,Aii, Yii, Oii);
    for(Index valI=0; valI < nrVals; valI++)
    {
        probs[valI] = _m_O_CPDs[oIndex]->Get(valI, iiI);
    }
    return(probs);
}